

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1f38a46::LowBDConvolveHorizRSTest_Correctness_Test::TestBody
          (LowBDConvolveHorizRSTest_Correctness_Test *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  TestImage<unsigned_char> *pTVar5;
  Message *pMVar6;
  void **val2;
  long lVar7;
  pointer puVar8;
  int iVar9;
  SEARCH_METHODS *pSVar10;
  long lVar11;
  size_t __n;
  pointer puVar12;
  ulong uVar13;
  uint uVar14;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  AssertHelper local_a8;
  uint local_a0;
  ACMRandom rnd;
  AssertionResult gtest_ar;
  int32_t tst_value;
  int32_t ref_value;
  ulong local_78;
  TestImage<unsigned_char> **local_70;
  long local_68;
  int *local_60;
  ConvolveHorizRSTestBase<unsigned_char> *local_58;
  long local_50;
  int *local_48;
  TestImage<unsigned_char> *local_40;
  int *local_38;
  
  rnd.random_.state_ = (Random)0xbaba;
  local_70 = &(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
              image_;
  uVar13 = 0;
  local_58 = (ConvolveHorizRSTestBase<unsigned_char> *)this;
  do {
    if ((int)uVar13 == 10) {
      return;
    }
    local_78 = uVar13;
    for (uVar14 = 9; uVar14 != 0x11; uVar14 = uVar14 + 1) {
      bVar1 = libaom_test::ACMRandom::Rand8(&rnd);
      bVar2 = libaom_test::ACMRandom::Rand8(&rnd);
      local_a0 = uVar14;
      uVar3 = libaom_test::ACMRandom::Rand16(&rnd);
      pTVar5 = (TestImage<unsigned_char> *)operator_new(0x50);
      uVar14 = local_a0;
      val2 = (void **)(ulong)local_a0;
      TestImage<unsigned_char>::TestImage
                (pTVar5,bVar2 + 0x80,bVar1 | 0x200,local_a0,uVar3 & 0x3fff,
                 ((ConvolveHorizRSTestBase<unsigned_char> *)this)->bd_);
      *local_70 = pTVar5;
      local_b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      CmpHelperNE<(anonymous_namespace)::TestImage<unsigned_char>*,decltype(nullptr)>
                (&gtest_ar.success_,(char *)local_70,(TestImage<unsigned_char> **)&local_b0,val2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar10 = "";
        }
        else {
          pSVar10 = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                   ,0xcd,(char *)pSVar10);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        return;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      ConvolveHorizRSTestBase<unsigned_char>::Prep
                ((ConvolveHorizRSTestBase<unsigned_char> *)this,&rnd);
      (*(((ConvolveHorizRSTestBase<unsigned_char> *)this)->super_Test)._vptr_Test[6])(this,1);
      (*(((ConvolveHorizRSTestBase<unsigned_char> *)this)->super_Test)._vptr_Test[6])(this,0);
      pTVar5 = ((ConvolveHorizRSTestBase<unsigned_char> *)this)->image_;
      iVar9 = pTVar5->h_;
      local_68 = (long)pTVar5->dst_stride_;
      puVar12 = (pTVar5->dst_data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      __n = (size_t)(pTVar5->dst_stride_ * (iVar9 + 0x40));
      iVar4 = bcmp(puVar12,puVar12 + __n,__n);
      if (iVar4 == 0) {
LAB_0073dd05:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&(pTVar5->dst_data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&(pTVar5->src_data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      else {
        local_60 = &pTVar5->h_;
        local_38 = &pTVar5->superres_denom_;
        local_48 = &pTVar5->x0_;
        puVar8 = puVar12 + __n + local_68 * 0x20 + 0x20;
        puVar12 = puVar12 + local_68 * 0x20 + 0x20;
        lVar7 = 0x20;
        local_40 = pTVar5;
        while (lVar7 < iVar9 + 0x20) {
          local_50 = lVar7;
          for (lVar11 = 0; lVar11 + 0x20 < (long)pTVar5->w_dst_ + 0x20; lVar11 = lVar11 + 1) {
            ref_value = (int32_t)puVar12[lVar11];
            tst_value = (int32_t)puVar8[lVar11];
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"tst_value","ref_value",&tst_value,&ref_value);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_b0);
              std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),"Error at row: ");
              std::ostream::operator<<(local_b0._M_head_impl + 0x10,(int)lVar7 + -0x20);
              std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),", col: ");
              std::ostream::operator<<(local_b0._M_head_impl + 0x10,(int)lVar11);
              std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),", superres_denom: ");
              pMVar6 = testing::Message::operator<<((Message *)&local_b0,local_38);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [11])", height: ");
              pMVar6 = testing::Message::operator<<(pMVar6,local_60);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [14])", src_width: ");
              pMVar6 = testing::Message::operator<<(pMVar6,&local_40->w_src_);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [14])", dst_width: ");
              pMVar6 = testing::Message::operator<<(pMVar6,&pTVar5->w_dst_);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [7])", x0: ");
              pMVar6 = testing::Message::operator<<(pMVar6,local_48);
              pSVar10 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar10 = *(SEARCH_METHODS **)
                           gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                         ,0xa2,(char *)pSVar10);
              testing::internal::AssertHelper::operator=(&local_a8,pMVar6);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              if (local_b0._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_b0._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
          }
          iVar9 = *local_60;
          puVar8 = puVar8 + local_68;
          puVar12 = puVar12 + local_68;
          lVar7 = local_50 + 1;
        }
        pTVar5 = *local_70;
        this = (LowBDConvolveHorizRSTest_Correctness_Test *)local_58;
        uVar14 = local_a0;
        if (pTVar5 != (TestImage<unsigned_char> *)0x0) goto LAB_0073dd05;
        pTVar5 = (TestImage<unsigned_char> *)0x0;
      }
      uVar13 = local_78;
      operator_delete(pTVar5);
    }
    uVar13 = (ulong)((int)uVar13 + 1);
  } while( true );
}

Assistant:

TEST_P(LowBDConvolveHorizRSTest, Correctness) { CorrectnessTest(); }